

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_hash.c
# Opt level: O3

void adt_hash_destroy(adt_hash_t *self)

{
  adt_hnode_t *node;
  
  if (self != (adt_hash_t *)0x0) {
    node = self->root;
    if (node != (adt_hnode_t *)0x0) {
      adt_hnode_destroy(node,self->pDestructor);
      free(node);
      self->root = (adt_hnode_t *)0x0;
    }
    adt_stack_destroy(&self->iter_stack);
    self->u32Size = 0;
  }
  return;
}

Assistant:

void adt_hash_destroy(adt_hash_t *self){
	if(self == 0) return;
	if(self->root != 0){
		adt_hnode_delete(self->root,self->pDestructor);
		self->root = 0;
	}
	adt_stack_destroy(&self->iter_stack);
	self->u32Size = 0;
}